

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcPumpType::IfcPumpType(IfcPumpType *this)

{
  IfcPumpType *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1e0,"IfcPumpType");
  Schema_2x3::IfcFlowMovingDeviceType::IfcFlowMovingDeviceType
            (&this->super_IfcFlowMovingDeviceType,&PTR_construction_vtable_24__00f9f9d0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcPumpType,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcPumpType,_1UL> *)
             &(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.field_0x1b0
             ,&PTR_construction_vtable_24__00f9fbb0);
  *(undefined8 *)
   &(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject =
       0xf9f850;
  *(undefined8 *)&this->field_0x1e0 = 0xf9f9b8;
  *(undefined8 *)
   &(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0x88 = 0xf9f878;
  (this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.
  super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0xf9f8a0;
  *(undefined8 *)
   &(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0xf0 = 0xf9f8c8;
  *(undefined8 *)
   &(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x148 =
       0xf9f8f0;
  *(undefined8 *)
   &(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x180 = 0xf9f918;
  *(undefined8 *)
   &(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x190 = 0xf9f940;
  *(undefined8 *)
   &(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.field_0x1a0 = 0xf9f968;
  *(undefined8 *)
   &(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.field_0x1b0 =
       0xf9f990;
  std::__cxx11::string::string((string *)&(this->super_IfcFlowMovingDeviceType).field_0x1c0);
  return;
}

Assistant:

IfcPumpType() : Object("IfcPumpType") {}